

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSTypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field,BytesMode bytes_mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  once_flag *poVar3;
  bool bVar4;
  GeneratorOptions *pGVar5;
  uint *descriptor;
  char *pcVar6;
  char *pcVar7;
  GeneratorOptions *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  poVar3 = (once_flag *)(options->namespace_prefix).field_2._M_allocated_capacity;
  if (poVar3 != (once_flag *)0x0) {
    local_28 = FieldDescriptor::TypeOnceInit;
    local_30 = options;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (poVar3,&local_28,(FieldDescriptor **)&local_30);
  }
  descriptor = &switchD_0024cd59::switchdataD_0039b42c;
  switch(*(undefined4 *)
          (FieldDescriptor::kTypeToCppTypeMap +
          (ulong)*(uint *)((long)&(options->namespace_prefix).field_2 + 8) * 4)) {
  case 1:
  case 2:
  case 3:
  case 4:
    bVar4 = anon_unknown_0::IsIntegralFieldWithStringJSType((FieldDescriptor *)options);
    pcVar7 = "number";
    if (bVar4) {
      pcVar7 = "string";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "";
    if (bVar4) {
      pcVar6 = "";
    }
    break;
  case 5:
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "number";
    pcVar6 = "";
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "boolean";
    pcVar6 = "";
    break;
  case 8:
    pGVar5 = (GeneratorOptions *)FieldDescriptor::enum_type((FieldDescriptor *)options);
    GetEnumPath_abi_cxx11_(__return_storage_ptr__,this,pGVar5,(EnumDescriptor *)descriptor);
    return __return_storage_ptr__;
  case 9:
    poVar3 = (once_flag *)(options->namespace_prefix).field_2._M_allocated_capacity;
    if (poVar3 != (once_flag *)0x0) {
      local_28 = FieldDescriptor::TypeOnceInit;
      local_30 = options;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (poVar3,&local_28,(FieldDescriptor **)&local_30);
    }
    paVar1 = &__return_storage_ptr__->field_2;
    iVar2 = *(int *)((long)&(options->namespace_prefix).field_2 + 8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    if (iVar2 == 0xc) {
      if ((int)field == 2) {
        paVar1->_M_allocated_capacity = 0x72724138746e6955;
        *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 8) = 0x7961;
        __return_storage_ptr__->_M_string_length = 10;
        (__return_storage_ptr__->field_2)._M_local_buf[10] = '\0';
        return __return_storage_ptr__;
      }
      if ((int)field != 1) {
        pcVar7 = "(string|Uint8Array)";
        pcVar6 = "";
        break;
      }
    }
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 4) = 0x676e;
    *(undefined4 *)paVar1 = 0x69727473;
    __return_storage_ptr__->_M_string_length = 6;
    (__return_storage_ptr__->field_2)._M_local_buf[6] = '\0';
    return __return_storage_ptr__;
  case 10:
    pGVar5 = (GeneratorOptions *)FieldDescriptor::message_type((FieldDescriptor *)options);
    GetMessagePath_abi_cxx11_(__return_storage_ptr__,this,pGVar5,(Descriptor *)descriptor);
    return __return_storage_ptr__;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "";
    pcVar7 = pcVar6;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string JSTypeName(const GeneratorOptions& options,
                       const FieldDescriptor* field, BytesMode bytes_mode) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return "boolean";
    case FieldDescriptor::CPPTYPE_INT32:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_INT64:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_UINT32:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_UINT64:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "number";
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "number";
    case FieldDescriptor::CPPTYPE_STRING:
      return JSStringTypeName(options, field, bytes_mode);
    case FieldDescriptor::CPPTYPE_ENUM:
      return GetEnumPath(options, field->enum_type());
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return GetMessagePath(options, field->message_type());
    default:
      return "";
  }
}